

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_checked.hh
# Opt level: O0

uint64_t __thiscall doublechecked::Roaring::rank(Roaring *this,uint32_t x)

{
  bool bVar1;
  iterator result;
  reference puVar2;
  uint in_ESI;
  char *in_RDI;
  iterator it_end;
  iterator it;
  uint64_t count;
  uint64_t ans;
  undefined4 in_stack_ffffffffffffffb8;
  uint32_t in_stack_ffffffffffffffbc;
  uint7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  bool bVar3;
  _Self local_28;
  long local_20;
  uint64_t local_18;
  uint local_c;
  
  local_c = in_ESI;
  local_18 = roaring::Roaring::rank
                       ((Roaring *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffbc);
  local_20 = 0;
  local_28._M_node =
       (_Base_ptr)
       std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                 ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                  CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  result = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                     ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                      CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  while( true ) {
    bVar1 = std::operator!=(&local_28,(_Self *)&stack0xffffffffffffffd0);
    bVar3 = false;
    if (bVar1) {
      puVar2 = std::_Rb_tree_const_iterator<unsigned_int>::operator*
                         ((_Rb_tree_const_iterator<unsigned_int> *)0x104fbc);
      bVar3 = *puVar2 <= local_c;
    }
    if (bVar3 == false) break;
    local_20 = local_20 + 1;
    std::_Rb_tree_const_iterator<unsigned_int>::operator++
              ((_Rb_tree_const_iterator<unsigned_int> *)CONCAT17(bVar3,in_stack_ffffffffffffffc0));
  }
  _assert_true((unsigned_long)result._M_node,in_RDI,(char *)(ulong)in_stack_ffffffffffffffc0,
               in_stack_ffffffffffffffbc);
  return local_18;
}

Assistant:

uint64_t rank(uint32_t x) const {
        uint64_t ans = plain.rank(x);

        uint64_t count = 0;
        auto it = check.begin();
        auto it_end = check.end();
        for (; it != it_end && *it <= x; ++it) ++count;
        assert_true(ans == count);

        return ans;
    }